

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_archive.cpp
# Opt level: O0

void __thiscall myEmployeeBoss::ArchiveOUT(myEmployeeBoss *this,ChArchiveOut *marchive)

{
  ChArchiveOut *pCVar1;
  ChNameValue<myEmployee> local_58;
  ChNameValue<bool> local_30;
  ChArchiveOut *local_18;
  ChArchiveOut *marchive_local;
  myEmployeeBoss *this_local;
  
  local_18 = marchive;
  marchive_local = (ChArchiveOut *)this;
  chrono::ChArchiveOut::VersionWrite<myEmployeeBoss>(marchive);
  myEmployee::ArchiveOUT(&this->super_myEmployee,local_18);
  pCVar1 = local_18;
  chrono::make_ChNameValue<bool>(&local_30,"is_dumb",&this->is_dumb,'\0');
  chrono::ChArchiveOut::operator<<(pCVar1,&local_30);
  chrono::ChNameValue<bool>::~ChNameValue(&local_30);
  pCVar1 = local_18;
  chrono::make_ChNameValue<myEmployee>(&local_58,"slave",&this->slave,'\0');
  chrono::ChArchiveOut::operator<<(pCVar1,&local_58);
  chrono::ChNameValue<myEmployee>::~ChNameValue(&local_58);
  return;
}

Assistant:

virtual void ArchiveOUT(ChArchiveOut& marchive)  //##### for Chrono serialization
    {
        // suggested: use versioning
        marchive.VersionWrite<myEmployeeBoss>();
        // remember to serialize the parent class data too!!!
        myEmployee::ArchiveOUT(marchive);

        // stream out member data
        marchive << CHNVP(is_dumb);
        marchive << CHNVP(slave);  // this added only from version >1
    }